

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O0

error builtin_multiply(vector *vargs,atom *result)

{
  atom aVar1;
  undefined4 uStack_3c;
  ulong local_30;
  size_t i;
  double r;
  atom *result_local;
  vector *vargs_local;
  
  i = 0x3ff0000000000000;
  local_30 = 0;
  while( true ) {
    if (vargs->size <= local_30) {
      aVar1 = make_number((double)i);
      *(ulong *)result = CONCAT44(uStack_3c,aVar1.type);
      result->value = aVar1.value;
      return ERROR_OK;
    }
    if (vargs->data[local_30].type != T_NUM) break;
    i = (size_t)(vargs->data[local_30].value.number * (double)i);
    local_30 = local_30 + 1;
  }
  return ERROR_TYPE;
}

Assistant:

error builtin_multiply(struct vector *vargs, atom *result)
{
	double r = 1;
	size_t i;
	for (i = 0; i < vargs->size; i++) {
		if (vargs->data[i].type != T_NUM) return ERROR_TYPE;
		r *= vargs->data[i].value.number;
	}
	*result = make_number(r);
	return ERROR_OK;
}